

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *stream,QEasingCurve *easing)

{
  QEasingCurvePrivate *pQVar1;
  QEasingCurveFunction *func;
  Type type;
  long in_FS_OFFSET;
  bool hasConfig;
  quint64 ptr_func;
  quint8 int_type;
  bool local_39;
  undefined1 *local_38;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = 0xaa;
  QDataStream::operator>>(stream,(qint8 *)&local_29);
  type = (Type)local_29;
  if (local_29 == 0x2f) {
    operator>>();
    type = Linear;
  }
  QEasingCurve::setType(easing,type);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::operator>>(stream,(qint64 *)&local_38);
  local_39 = true;
  QDataStream::operator>>(stream,&local_39);
  pQVar1 = easing->d_ptr;
  if (pQVar1->config != (QEasingCurveFunction *)0x0) {
    (*pQVar1->config->_vptr_QEasingCurveFunction[1])();
    pQVar1 = easing->d_ptr;
  }
  pQVar1->config = (QEasingCurveFunction *)0x0;
  if (local_39 == true) {
    func = curveToFunctionObject(type);
    operator>>(stream,func);
    easing->d_ptr->config = func;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QEasingCurve &easing)
{
    QEasingCurve::Type type;
    quint8 int_type;
    stream >> int_type;
    type = static_cast<QEasingCurve::Type>(int_type);
    if (type == QEasingCurve::Custom) {
        qWarning("QEasingCurve: Cannot deserialize an easing curve with a custom easing function");
        stream.setStatus(QDataStream::ReadCorruptData);
        type = QEasingCurve::Linear;
    }
    easing.setType(type);

    // Unused; for backwards compatibility
    [[maybe_unused]] quint64 ptr_func;
    stream >> ptr_func;

    bool hasConfig;
    stream >> hasConfig;
    delete easing.d_ptr->config;
    easing.d_ptr->config = nullptr;
    if (hasConfig) {
        QEasingCurveFunction *config = curveToFunctionObject(type);
        stream >> config;
        easing.d_ptr->config = config;
    }
    return stream;
}